

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O3

QRect __thiscall QEvdevTouchScreenData::screenGeometry(QEvdevTouchScreenData *this)

{
  QObject *pQVar1;
  QScreen *pQVar2;
  undefined8 uVar3;
  char cVar4;
  QWindow *context;
  QScreen *context_00;
  Data *pDVar5;
  Data *pDVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  QRect QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QArrayData *local_70;
  storage_type_conflict *local_68;
  long local_60;
  QRect local_58;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_forceToActiveWindow == true) {
    context = (QWindow *)QGuiApplication::focusWindow();
    if (context == (QWindow *)0x0) {
LAB_0010b9fa:
      uVar7 = 0xffffffff;
      QVar10 = (QRect)(ZEXT816(0xffffffff00000000) << 0x40);
      goto LAB_0010ba2a;
    }
    local_58 = (QRect)QWindow::geometry();
    QVar10 = QHighDpi::toNativeWindowGeometry<QRect,QWindow>(&local_58,context);
  }
  else {
    context_00 = (QScreen *)QGuiApplication::primaryScreen();
    if ((this->m_screenName).d.size == 0) {
LAB_0010ba06:
      if (context_00 == (QScreen *)0x0) goto LAB_0010b9fa;
    }
    else {
      pDVar6 = (this->m_screen).wp.d;
      if (((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) ||
         ((this->m_screen).wp.value == (QObject *)0x0)) {
        local_48 = -0x5555555555555556;
        local_58._0_8_ = (QArrayData *)0xaaaaaaaaaaaaaaaa;
        local_58.x2.m_i = -0x55555556;
        local_58.y2.m_i = -0x55555556;
        QGuiApplication::screens();
        uVar3 = local_58._8_8_;
        if (local_48 != 0) {
          lVar8 = local_48 << 3;
          lVar9 = 0;
          do {
            pQVar1 = *(QObject **)(uVar3 + lVar9);
            QScreen::name();
            if (local_60 == (this->m_screenName).d.size) {
              QVar11.m_data = (this->m_screenName).d.ptr;
              QVar11.m_size = local_60;
              QVar12.m_data = local_68;
              QVar12.m_size = local_60;
              cVar4 = QtPrivate::equalStrings(QVar12,QVar11);
            }
            else {
              cVar4 = '\0';
            }
            if (local_70 != (QArrayData *)0x0) {
              LOCK();
              (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_70,2,0x10);
              }
            }
            if (cVar4 != '\0') {
              pDVar5 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar1);
              pDVar6 = (this->m_screen).wp.d;
              (this->m_screen).wp.d = pDVar5;
              (this->m_screen).wp.value = pQVar1;
              if (pDVar6 != (Data *)0x0) {
                LOCK();
                *(int *)pDVar6 = *(int *)pDVar6 + -1;
                UNLOCK();
                if (*(int *)pDVar6 == 0) {
                  operator_delete(pDVar6);
                }
              }
              break;
            }
            lVar9 = lVar9 + 8;
          } while (lVar8 != lVar9);
        }
        if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58._0_8_,8,0x10);
          }
        }
        pDVar6 = (this->m_screen).wp.d;
        if (pDVar6 == (Data *)0x0) goto LAB_0010ba06;
      }
      pQVar2 = (QScreen *)(this->m_screen).wp.value;
      if (pQVar2 == (QScreen *)0x0 || *(int *)(pDVar6 + 4) == 0) goto LAB_0010ba06;
      context_00 = pQVar2;
      if (*(int *)(pDVar6 + 4) == 0) goto LAB_0010b9fa;
    }
    local_58 = (QRect)QScreen::geometry();
    QVar10 = QHighDpi::toNativePixels<QRect,QScreen>(&local_58,context_00);
  }
  uVar7 = QVar10._8_8_;
LAB_0010ba2a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  uVar7 = uVar7 & 0xffffffff | QVar10._8_8_ & 0xffffffff00000000;
  QVar10.x2.m_i = (int)uVar7;
  QVar10.y2.m_i = (int)(uVar7 >> 0x20);
  return QVar10;
}

Assistant:

QRect QEvdevTouchScreenData::screenGeometry() const
{
    if (m_forceToActiveWindow) {
        QWindow *win = QGuiApplication::focusWindow();
        return win ? QHighDpi::toNativeWindowGeometry(win->geometry(), win) : QRect();
    }

    // Now it becomes tricky. Traditionally we picked the primaryScreen()
    // and were done with it. But then, enter multiple screens, and
    // suddenly it was all broken.
    //
    // For now we only support the display configuration of the KMS/DRM
    // backends of eglfs. See QOutputMapping.
    //
    // The good news it that once winRect refers to the correct screen
    // geometry in the full virtual desktop space, there is nothing else
    // left to do since qguiapp will handle the rest.
    QScreen *screen = QGuiApplication::primaryScreen();
    if (!m_screenName.isEmpty()) {
        if (!m_screen) {
            const QList<QScreen *> screens = QGuiApplication::screens();
            for (QScreen *s : screens) {
                if (s->name() == m_screenName) {
                    m_screen = s;
                    break;
                }
            }
        }
        if (m_screen)
            screen = m_screen;
    }
    return screen ? QHighDpi::toNativePixels(screen->geometry(), screen) : QRect();
}